

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

int Ssw_ManSweepBmc(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Ssw_Sat_t *p_01;
  FILE *pFile;
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  abctime aVar7;
  abctime clk;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Bar_Progress_t *pProgress;
  Ssw_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  aVar3 = Abc_Clock();
  iVar1 = Aig_ManObjNumMax(p->pAig);
  pAVar4 = Aig_ManStart(iVar1 * p->pPars->nFramesK);
  p->pFrames = pAVar4;
  for (clk._4_4_ = 0; iVar1 = Saig_ManRegNum(p->pAig), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1)
  {
    p_00 = p->pAig->vCis;
    iVar1 = Saig_ManPiNum(p->pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,clk._4_4_ + iVar1);
    pAVar6 = Aig_ManConst0(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar5,0,pAVar6);
  }
  p->fRefined = 0;
  pFile = _stdout;
  if (p->pPars->fVerbose != 0) {
    iVar1 = Aig_ManObjNumMax(p->pAig);
    pObj = (Aig_Obj_t *)Bar_ProgressStart(pFile,iVar1 * p->pPars->nFramesK);
  }
  for (clk._0_4_ = 0; (int)clk < p->pPars->nFramesK; clk._0_4_ = (int)clk + 1) {
    pAVar5 = Aig_ManConst1(p->pAig);
    pAVar6 = Aig_ManConst1(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar5,(int)clk,pAVar6);
    for (clk._4_4_ = 0; iVar1 = Saig_ManPiNum(p->pAig), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1
        ) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,clk._4_4_);
      pAVar6 = Aig_ObjCreateCi(p->pFrames);
      Ssw_ObjSetFrame(p,pAVar5,(int)clk,pAVar6);
    }
    for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,clk._4_4_);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar5), iVar1 != 0)) {
        if (p->pPars->fVerbose != 0) {
          iVar1 = Aig_ManObjNumMax(p->pAig);
          Bar_ProgressUpdate((Bar_Progress_t *)pObj,iVar1 * (int)clk + clk._4_4_,(char *)0x0);
        }
        pAVar4 = p->pFrames;
        pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,(int)clk);
        p1 = Ssw_ObjChild1Fra(p,pAVar5,(int)clk);
        pAVar6 = Aig_And(pAVar4,pAVar6,p1);
        Ssw_ObjSetFrame(p,pAVar5,(int)clk,pAVar6);
        uVar2 = Ssw_ManSweepNode(p,pAVar5,(int)clk,1,(Vec_Int_t *)0x0);
        p->fRefined = uVar2 | p->fRefined;
      }
    }
    if ((int)clk == p->pPars->nFramesK + -1) break;
    for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vCos), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,clk._4_4_);
      pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,(int)clk);
      Ssw_ObjSetFrame(p,pAVar5,(int)clk,pAVar6);
    }
    for (clk._4_4_ = 0; iVar1 = Saig_ManRegNum(p->pAig), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      pAVar5 = Saig_ManLi(p->pAig,clk._4_4_);
      pAVar6 = Saig_ManLo(p->pAig,clk._4_4_);
      pAVar5 = Ssw_ObjFrame(p,pAVar5,(int)clk);
      Ssw_ObjSetFrame(p,pAVar6,(int)clk + 1,pAVar5);
      p_01 = p->pMSat;
      pAVar5 = Aig_Regular(pAVar5);
      Ssw_CnfNodeAddToSolver(p_01,pAVar5);
    }
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop((Bar_Progress_t *)pObj);
  }
  aVar7 = Abc_Clock();
  p->timeBmc = (aVar7 - aVar3) + p->timeBmc;
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmc( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // sweep internal nodes
    p->fRefined = 0;
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            if ( p->pPars->fVerbose )
                Bar_ProgressUpdate( pProgress, Aig_ManObjNumMax(p->pAig) * f + i, NULL );
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 1, NULL );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}